

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterate.cc
# Opt level: O2

void __thiscall ipx::Iterate::make_implied_eq(Iterate *this,Int j)

{
  (this->xl_)._M_data[j] = INFINITY;
  (this->xu_)._M_data[j] = INFINITY;
  (this->zl_)._M_data[j] = 0.0;
  (this->zu_)._M_data[j] = 0.0;
  (this->variable_state_).
  super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>._M_impl.
  super__Vector_impl_data._M_start[j] = IMPLIED_EQ;
  this->evaluated_ = false;
  return;
}

Assistant:

void Iterate::make_implied_eq(Int j) {
    xl_[j] = INFINITY;
    xu_[j] = INFINITY;
    zl_[j] = 0.0;
    zu_[j] = 0.0;
    variable_state_[j] = StateDetail::IMPLIED_EQ;
    evaluated_ = false;
}